

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *sub,AppFormatMode mode)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  string local_288 [32];
  string local_268;
  string local_248 [39];
  allocator local_221;
  string local_220;
  string local_200;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream out;
  ostream local_1a0 [383];
  AppFormatMode local_21;
  App *pAStack_20;
  AppFormatMode mode_local;
  App *sub_local;
  Formatter *this_local;
  
  local_21 = mode;
  pAStack_20 = sub;
  sub_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  App::get_display_name_abi_cxx11_(&local_1d0,pAStack_20,true);
  poVar3 = ::std::operator<<(local_1a0,(string *)&local_1d0);
  ::std::operator<<(poVar3,'\n');
  ::std::__cxx11::string::~string((string *)&local_1d0);
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_200,this,pAStack_20);
  sVar1 = (this->super_FormatterBase).description_paragraph_width_;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_220,"  ",&local_221);
  detail::streamOutAsParagraph(local_1a0,&local_200,sVar1,&local_220,false);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
  ::std::__cxx11::string::~string((string *)&local_200);
  App::get_name_abi_cxx11_(pAStack_20);
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    pvVar5 = App::get_aliases_abi_cxx11_(pAStack_20);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar5);
    if (!bVar2) {
      pvVar5 = App::get_aliases_abi_cxx11_(pAStack_20);
      detail::format_aliases(local_1a0,pvVar5,(this->super_FormatterBase).column_width_ + 2);
    }
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(local_248,this,pAStack_20);
  ::std::operator<<(local_1a0,local_248);
  ::std::__cxx11::string::~string(local_248);
  make_groups_abi_cxx11_(&local_268,this,pAStack_20,local_21);
  ::std::operator<<(local_1a0,(string *)&local_268);
  ::std::__cxx11::string::~string((string *)&local_268);
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(local_288,this,pAStack_20,(ulong)local_21);
  ::std::operator<<(local_1a0,local_288);
  ::std::__cxx11::string::~string(local_288);
  (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&local_2a8,this,pAStack_20);
  sVar1 = (this->super_FormatterBase).footer_paragraph_width_;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
  detail::streamOutAsParagraph(local_1a0,&local_2a8,sVar1,&local_2c8,false);
  ::std::__cxx11::string::~string((string *)&local_2c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::operator<<(local_1a0,'\n');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_expanded(const App *sub, AppFormatMode mode) const {
    std::stringstream out;
    out << sub->get_display_name(true) << '\n';

    detail::streamOutAsParagraph(
        out, make_description(sub), description_paragraph_width_, "  ");  // Format description as paragraph

    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }

    out << make_positionals(sub);
    out << make_groups(sub, mode);
    out << make_subcommands(sub, mode);
    detail::streamOutAsParagraph(out, make_footer(sub), footer_paragraph_width_);  // Format footer as paragraph

    out << '\n';
    return out.str();
}